

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_parser_test.cpp
# Opt level: O2

void __thiscall read_ascii_from_string<double>::test_method(read_ascii_from_string<double> *this)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  pair<tyti::stl::basic_solid<double>,_bool> *this_00;
  shared_count *psVar1;
  assertion_result local_208;
  value_expr<bool_&> local_1f0;
  char *local_1e8;
  binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_const_char_(&)[7],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_void>_>
  local_1e0;
  lazy_ostream local_1d0;
  undefined1 *local_1c0;
  binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_const_char_(&)[7],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_void>_>
  *local_1b8;
  pair<tyti::stl::basic_solid<double>,_bool> out;
  string str;
  const_string local_120;
  const_string local_110;
  const_string local_100;
  const_string local_f0;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str,
             "solid Hi you\n         facet normal 0.5 0.6 0.7\n        outer loop\n        vertex 0.5 0.6 0.7\n        vertex 0.5 0.6 0.7\n        vertex 0.5 0.6 0.7\n        endloop\n        endfacet\n        endsolid Hi you\n"
             ,(allocator<char> *)&out);
  this_00 = &out;
  tyti::stl::read<double,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&out,(stl *)str._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(str._M_dataplus._M_p + str._M_string_length),in_RCX);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_40,0x1d,&local_50);
  local_1f0.m_value = &out.second;
  boost::test_tools::assertion::value_expr<bool_&>::evaluate(&local_208,&local_1f0,false);
  local_1b8 = &local_1e0;
  local_1e0.m_lhs.m_value =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17142b;
  local_1e0.m_rhs = (char (*) [7])0x171435;
  local_1d0.m_empty = false;
  local_1d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001aa980;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_60.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_1d0,&local_60,0x1d,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar1 = &local_208.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar1);
  local_70.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_70,0x1f,&local_80);
  local_1e0.m_rhs = (char (*) [7])0x171436;
  local_1e0.m_lhs.m_value =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_const_char_(&)[7],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_void>_>
  ::evaluate(&local_208,&local_1e0,false);
  local_1f0.m_value = (bool *)0x17143d;
  local_1e8 = "";
  local_1d0.m_empty = false;
  local_1d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001aa980;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_90.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_90.m_end = "";
  local_1b8 = (binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_const_char_(&)[7],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_void>_>
               *)&local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_1d0,&local_90,0x1f,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar1 = &local_208.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar1);
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_a0,0x20,&local_b0);
  local_1e0.m_lhs.m_value =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)out.first.normals.
               super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)out.first.normals.
              super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_1e0.m_rhs._0_4_ = 1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  ::evaluate(&local_208,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
              *)&local_1e0,false);
  local_1f0.m_value = (bool *)0x171452;
  local_1e8 = "";
  local_1d0.m_empty = false;
  local_1d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001aa980;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_c0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_c0.m_end = "";
  local_1b8 = (binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_const_char_(&)[7],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_void>_>
               *)&local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_1d0,&local_c0,0x20,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar1 = &local_208.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar1);
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_d0,0x21,&local_e0);
  local_1e0.m_lhs.m_value =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)out.first.vertices.
               super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)out.first.vertices.
              super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_1e0.m_rhs._0_4_ = 3;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  ::evaluate(&local_208,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
              *)&local_1e0,false);
  local_1f0.m_value = (bool *)0x171468;
  local_1e8 = "";
  local_1d0.m_empty = false;
  local_1d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001aa980;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_f0.m_end = "";
  local_1b8 = (binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_const_char_(&)[7],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_void>_>
               *)&local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_1d0,&local_f0,0x21,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar1 = &local_208.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar1);
  local_100.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_100.m_end = "";
  local_110.m_begin = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_100,0x22,&local_110);
  local_1e0.m_lhs.m_value =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)out.first.attributes.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)out.first.attributes.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start >> 1);
  local_1e0.m_rhs = (char (*) [7])((ulong)local_1e0.m_rhs._4_4_ << 0x20);
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  ::evaluate(&local_208,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
              *)&local_1e0,false);
  local_1f0.m_value = (bool *)0x17147f;
  local_1e8 = "";
  local_1d0.m_empty = false;
  local_1d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001aa980;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_120.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_120.m_end = "";
  local_1b8 = (binary_expr<boost::test_tools::assertion::value_expr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_const_char_(&)[7],_boost::test_tools::assertion::op::EQ<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_void>_>
               *)&local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_1d0,&local_120,0x22,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
  tyti::stl::basic_solid<double>::~basic_solid(&out.first);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(read_ascii_from_string, T, test_types)
{
    using solid = stl::basic_solid<T>;
    std::string str = "solid Hi you\n \
        facet normal 0.5 0.6 0.7\n\
        outer loop\n\
        vertex 0.5 0.6 0.7\n\
        vertex 0.5 0.6 0.7\n\
        vertex 0.5 0.6 0.7\n\
        endloop\n\
        endfacet\n\
        endsolid Hi you\n";

    auto out = stl::read<T>(str.begin(), str.end());

    BOOST_TEST(out.second);
    solid& s = out.first;
    BOOST_TEST(s.header == "Hi you");
    BOOST_TEST(s.normals.size() == 1);
    BOOST_TEST(s.vertices.size() == 3);
    BOOST_TEST(s.attributes.size() == 0);
}